

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer.c
# Opt level: O1

Vector * WorldPos2NDCPos(Vector *__return_storage_ptr__,Camera *camera,Vector worldVec)

{
  Matrix *b;
  Matrix *a;
  uint32_t in_ECX;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  unkbyte10 in_ST3;
  undefined1 auStack_78 [8];
  Real _worldPos [4] [1];
  
  _auStack_78 = worldVec.x._0_10_;
  _worldPos._8_10_ = worldVec.y._0_10_;
  _worldPos._24_10_ = worldVec.z._0_10_;
  _worldPos._40_10_ = (unkbyte10)1;
  b = MatrixFromArray(4,1,auStack_78);
  a = MatrixMultiplication(camera->world2ndc,b);
  MatrixGetElement((Real *)a,(Matrix *)0x3,0,in_ECX);
  MatrixGetElement((Real *)a,(Matrix *)0x0,0,in_ECX);
  *(longdouble *)&__return_storage_ptr__->x = -in_ST1 / in_ST0;
  MatrixGetElement((Real *)a,(Matrix *)0x1,0,in_ECX);
  *(longdouble *)&__return_storage_ptr__->y = -in_ST2 / in_ST0;
  MatrixGetElement((Real *)a,(Matrix *)0x2,0,in_ECX);
  *(unkbyte10 *)&__return_storage_ptr__->z = in_ST3;
  MatrixDestroy(a);
  MatrixDestroy(b);
  return __return_storage_ptr__;
}

Assistant:

Vector WorldPos2NDCPos(const Camera *camera, const Vector worldVec) {
  Real _worldPos[][1] = {{worldVec.x}, {worldVec.y}, {worldVec.z}, {1}};
  Matrix *worldPos = MatrixFromArray(4, 1, _worldPos);
  Matrix *_ndcPos = MatrixMultiplication(camera->world2ndc, worldPos);
  Real depth = MatrixGetElement(_ndcPos, 3, 0);
  Vector ndcPos = V(-MatrixGetElement(_ndcPos, 0, 0) / depth, -MatrixGetElement(_ndcPos, 1, 0) / depth, MatrixGetElement(_ndcPos, 2, 0)); // NOTE: Negative sign corrects orientation of image
  MatrixDestroy(_ndcPos);
  MatrixDestroy(worldPos);
  return ndcPos;
}